

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O3

TRef fold_bufstr_kfold_cse(jit_State *J)

{
  IROp1 IVar1;
  ushort uVar2;
  IRRef1 IVar3;
  IRIns *pIVar4;
  ushort uVar5;
  TRef TVar6;
  ulong uVar7;
  IRIns *pIVar8;
  IRIns *pIVar9;
  IROp1 IVar10;
  
  if ((J->flags >> 0x10 & 1) != 0) {
    IVar1 = (J->fold).left[0].field_1.o;
    if (IVar1 == 'T') {
      pIVar4 = (J->cur).ir;
      uVar7 = (ulong)(J->fold).left[0].field_0.op1;
      if ((*(char *)((long)pIVar4 + uVar7 * 8 + 5) == 'S') &&
         ((*(byte *)((long)pIVar4 + uVar7 * 8 + 2) & 1) == 0)) {
        uVar5 = (J->fold).left[0].field_0.op2;
LAB_0012fcf1:
        return (uint)uVar5;
      }
    }
    else if (IVar1 == 'S') {
      if (((ulong)(J->fold).left[0] & 0x10000) == 0) {
        TVar6 = lj_ir_kgc(J,(GCobj *)(J[-1].penalty + 0x3a),IRT_STR);
        return TVar6;
      }
      IVar3 = (J->fold).left[0].field_0.prev;
      (J->fold).ins.field_0.op1 = (J->fold).left[0].field_0.op1;
      (J->fold).ins.field_0.op2 = IVar3;
      TVar6 = lj_opt_cse(J);
      return TVar6;
    }
  }
  if (((J->flags >> 0x11 & 1) != 0) && (uVar5 = J->chain[0x55], uVar5 != 0)) {
    pIVar4 = (J->cur).ir;
    IVar1 = (J->fold).left[0].field_1.o;
    do {
      if (IVar1 == *(IROp1 *)((long)pIVar4 + (ulong)pIVar4[uVar5].field_0.op1 * 8 + 5)) {
        pIVar8 = pIVar4 + pIVar4[uVar5].field_0.op1;
        pIVar9 = (J->fold).left;
        IVar10 = IVar1;
        do {
          uVar2 = (pIVar9->field_0).op2;
          if (uVar2 != (pIVar8->field_0).op2) break;
          if ((IVar10 == 'S') && ((uVar2 & 1) == 0)) goto LAB_0012fcf1;
          if (IVar10 == '_' && uVar2 == 0x17) break;
          pIVar9 = pIVar4 + (pIVar9->field_0).op1;
          pIVar8 = pIVar4 + (pIVar8->field_0).op1;
          IVar10 = (pIVar9->field_1).o;
        } while (IVar10 == (pIVar8->field_1).o);
      }
      uVar5 = *(ushort *)((long)pIVar4 + (ulong)uVar5 * 8 + 6);
    } while (uVar5 != 0);
  }
  TVar6 = lj_ir_emit(J);
  return TVar6;
}

Assistant:

LJFOLD(BUFSTR any any)
LJFOLDF(bufstr_kfold_cse)
{
  lj_assertJ(fleft->o == IR_BUFHDR || fleft->o == IR_BUFPUT ||
	     fleft->o == IR_CALLL,
	     "bad buffer constructor IR op %d", fleft->o);
  if (LJ_LIKELY(J->flags & JIT_F_OPT_FOLD)) {
    if (fleft->o == IR_BUFHDR) {  /* No put operations? */
      if (!(fleft->op2 & IRBUFHDR_APPEND))  /* Empty buffer? */
	return lj_ir_kstr(J, &J2G(J)->strempty);
      fins->op1 = fleft->op1;
      fins->op2 = fleft->prev;  /* Relies on checks in bufput_append. */
      return CSEFOLD;
    } else if (fleft->o == IR_BUFPUT) {
      IRIns *irb = IR(fleft->op1);
      if (irb->o == IR_BUFHDR && !(irb->op2 & IRBUFHDR_APPEND))
	return fleft->op2;  /* Shortcut for a single put operation. */
    }
  }
  /* Try to CSE the whole chain. */
  if (LJ_LIKELY(J->flags & JIT_F_OPT_CSE)) {
    IRRef ref = J->chain[IR_BUFSTR];
    while (ref) {
      IRIns *irs = IR(ref), *ira = fleft, *irb = IR(irs->op1);
      while (ira->o == irb->o && ira->op2 == irb->op2) {
	lj_assertJ(ira->o == IR_BUFHDR || ira->o == IR_BUFPUT ||
		   ira->o == IR_CALLL || ira->o == IR_CARG,
		   "bad buffer constructor IR op %d", ira->o);
	if (ira->o == IR_BUFHDR && !(ira->op2 & IRBUFHDR_APPEND))
	  return ref;  /* CSE succeeded. */
	if (ira->o == IR_CALLL && ira->op2 == IRCALL_lj_buf_puttab)
	  break;
	ira = IR(ira->op1);
	irb = IR(irb->op1);
      }
      ref = irs->prev;
    }
  }
  return EMITFOLD;  /* No CSE possible. */
}